

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback,void *user_data)

{
  ImVector<unsigned_int> *pIVar1;
  ImVec4 *pIVar2;
  ImVec4 *pIVar3;
  ImGuiWindow *pIVar4;
  char *pcVar5;
  ImGuiColorMod *pIVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImGuiContext *pIVar10;
  ImGuiContext *pIVar11;
  char *pcVar12;
  ImGuiWindow *pIVar13;
  int iVar14;
  long lVar15;
  
  pIVar10 = GImGui;
  iVar14 = (GImGui->CurrentWindowStack).Size;
  while( true ) {
    if (iVar14 < 1) {
      return;
    }
    pIVar4 = pIVar10->CurrentWindow;
    pIVar13 = pIVar4;
    if (pIVar10->CurrentTabBar == (ImGuiTabBar *)0x0) goto LAB_0012a90e;
    do {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndTabBar() in \'%s\'",pIVar4->Name);
      }
      EndTabBar();
    } while (pIVar10->CurrentTabBar != (ImGuiTabBar *)0x0);
    while( true ) {
      pIVar13 = pIVar10->CurrentWindow;
LAB_0012a90e:
      if ((pIVar13->DC).TreeDepth < 1) break;
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing TreePop() in \'%s\'",pIVar4->Name);
      }
      TreePop();
    }
    while ((int)(pIVar13->DC).StackSizesOnBegin.SizeOfGroupStack < (pIVar10->GroupStack).Size) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndGroup() in \'%s\'",pIVar4->Name);
      }
      EndGroup();
      pIVar13 = pIVar10->CurrentWindow;
    }
    iVar14 = (pIVar13->IDStack).Size;
    while (1 < iVar14) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopID() in \'%s\'",pIVar4->Name);
        pIVar13 = pIVar10->CurrentWindow;
      }
      pIVar1 = &GImGui->CurrentWindow->IDStack;
      pIVar1->Size = pIVar1->Size + -1;
      iVar14 = (pIVar13->IDStack).Size;
    }
    iVar14 = (pIVar10->ColorStack).Size;
    while ((pIVar13->DC).StackSizesOnBegin.SizeOfColorStack < iVar14) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        pcVar5 = pIVar4->Name;
        pcVar12 = GetStyleColorName((pIVar10->ColorStack).Data[(long)iVar14 + -1].Col);
        (*log_callback)(user_data,"Recovered from missing PopStyleColor() in \'%s\' for ImGuiCol_%s"
                        ,pcVar5,pcVar12);
      }
      pIVar11 = GImGui;
      lVar15 = (long)(GImGui->ColorStack).Size;
      pIVar6 = (GImGui->ColorStack).Data;
      pIVar2 = &pIVar6[lVar15 + -1].BackupValue;
      fVar7 = pIVar2->y;
      fVar8 = pIVar2->z;
      fVar9 = pIVar2->w;
      pIVar3 = (GImGui->Style).Colors + pIVar6[lVar15 + -1].Col;
      pIVar3->x = pIVar2->x;
      pIVar3->y = fVar7;
      pIVar3->z = fVar8;
      pIVar3->w = fVar9;
      (pIVar11->ColorStack).Size = (pIVar11->ColorStack).Size + -1;
      pIVar13 = pIVar10->CurrentWindow;
      iVar14 = (pIVar10->ColorStack).Size;
    }
    while ((int)(pIVar13->DC).StackSizesOnBegin.SizeOfStyleVarStack < (pIVar10->StyleVarStack).Size)
    {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopStyleVar() in \'%s\'",pIVar4->Name);
      }
      PopStyleVar(1);
      pIVar13 = pIVar10->CurrentWindow;
    }
    while ((int)(pIVar13->DC).StackSizesOnBegin.SizeOfFocusScopeStack <
           (pIVar10->FocusScopeStack).Size) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing PopFocusScope() in \'%s\'",pIVar4->Name);
        pIVar13 = pIVar10->CurrentWindow;
      }
      pIVar11 = GImGui;
      iVar14 = (GImGui->FocusScopeStack).Size;
      (GImGui->CurrentWindow->DC).NavFocusScopeIdCurrent =
           (GImGui->FocusScopeStack).Data[(long)iVar14 + -1];
      (pIVar11->FocusScopeStack).Size = iVar14 + -1;
    }
    if ((pIVar10->CurrentWindowStack).Size == 1) break;
    if ((pIVar13->Flags & 0x1000000) == 0) {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing End() for \'%s\'",pIVar4->Name);
      }
      End();
    }
    else {
      if (log_callback != (ImGuiErrorLogCallback)0x0) {
        (*log_callback)(user_data,"Recovered from missing EndChild() for \'%s\'",pIVar4->Name);
      }
      EndChild();
    }
    iVar14 = (pIVar10->CurrentWindowStack).Size;
  }
  return;
}

Assistant:

void    ImGui::ErrorCheckEndFrameRecover(ImGuiErrorLogCallback log_callback, void* user_data)
{
    // PVS-Studio V1044 is "Loop break conditions do not depend on the number of iterations"
    ImGuiContext& g = *GImGui;
    while (g.CurrentWindowStack.Size > 0)
    {
#ifdef IMGUI_HAS_TABLE
        while (g.CurrentTable && (g.CurrentTable->OuterWindow == g.CurrentWindow || g.CurrentTable->InnerWindow == g.CurrentWindow))
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndTable() in '%s'", g.CurrentTable->OuterWindow->Name);
            EndTable();
        }
#endif
        ImGuiWindow* window = g.CurrentWindow;
        while (g.CurrentTabBar != NULL) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndTabBar() in '%s'", window->Name);
            EndTabBar();
        }
        while (g.CurrentWindow->DC.TreeDepth > 0) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing TreePop() in '%s'", window->Name);
            TreePop();
        }
        while (g.GroupStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfGroupStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndGroup() in '%s'", window->Name);
            EndGroup();
        }
        while (g.CurrentWindow->IDStack.Size > 1) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopID() in '%s'", window->Name);
            PopID();
        }
        while (g.ColorStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfColorStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopStyleColor() in '%s' for ImGuiCol_%s", window->Name, GetStyleColorName(g.ColorStack.back().Col));
            PopStyleColor();
        }
        while (g.StyleVarStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfStyleVarStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopStyleVar() in '%s'", window->Name);
            PopStyleVar();
        }
        while (g.FocusScopeStack.Size > g.CurrentWindow->DC.StackSizesOnBegin.SizeOfFocusScopeStack) //-V1044
        {
            if (log_callback) log_callback(user_data, "Recovered from missing PopFocusScope() in '%s'", window->Name);
            PopFocusScope();
        }
        if (g.CurrentWindowStack.Size == 1)
        {
            IM_ASSERT(g.CurrentWindow->IsFallbackWindow);
            break;
        }
        if (g.CurrentWindow->Flags & ImGuiWindowFlags_ChildWindow)
        {
            if (log_callback) log_callback(user_data, "Recovered from missing EndChild() for '%s'", window->Name);
            EndChild();
        }
        else
        {
            if (log_callback) log_callback(user_data, "Recovered from missing End() for '%s'", window->Name);
            End();
        }
    }
}